

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::bitrv216neg(double *a)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long in_RDI;
  double x7i;
  double x7r;
  double x6i;
  double x6r;
  double x5i;
  double x5r;
  double x4i;
  double x4r;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x15i;
  double x15r;
  double x14i;
  double x14r;
  double x13i;
  double x13r;
  double x12i;
  double x12r;
  double x11i;
  double x11r;
  double x10i;
  double x10r;
  double x9i;
  double x9r;
  double x8i;
  double x8r;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x10);
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  uVar3 = *(undefined8 *)(in_RDI + 0x20);
  uVar4 = *(undefined8 *)(in_RDI + 0x28);
  uVar5 = *(undefined8 *)(in_RDI + 0x30);
  uVar6 = *(undefined8 *)(in_RDI + 0x38);
  uVar7 = *(undefined8 *)(in_RDI + 0x40);
  uVar8 = *(undefined8 *)(in_RDI + 0x48);
  uVar9 = *(undefined8 *)(in_RDI + 0x50);
  uVar10 = *(undefined8 *)(in_RDI + 0x58);
  uVar11 = *(undefined8 *)(in_RDI + 0x60);
  uVar12 = *(undefined8 *)(in_RDI + 0x68);
  uVar13 = *(undefined8 *)(in_RDI + 0x80);
  uVar14 = *(undefined8 *)(in_RDI + 0x88);
  uVar15 = *(undefined8 *)(in_RDI + 0xa0);
  uVar16 = *(undefined8 *)(in_RDI + 0xa8);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0xf0);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0xf8);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x78);
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0xb0);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0xb8);
  *(undefined8 *)(in_RDI + 0x40) = uVar5;
  *(undefined8 *)(in_RDI + 0x48) = uVar6;
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0xd0);
  *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0xd8);
  *(undefined8 *)(in_RDI + 0x60) = uVar9;
  *(undefined8 *)(in_RDI + 0x68) = uVar10;
  *(undefined8 *)(in_RDI + 0x70) = *(undefined8 *)(in_RDI + 0x90);
  *(undefined8 *)(in_RDI + 0x78) = *(undefined8 *)(in_RDI + 0x98);
  *(undefined8 *)(in_RDI + 0x80) = uVar1;
  *(undefined8 *)(in_RDI + 0x88) = uVar2;
  *(undefined8 *)(in_RDI + 0x90) = *(undefined8 *)(in_RDI + 0xe0);
  *(undefined8 *)(in_RDI + 0x98) = *(undefined8 *)(in_RDI + 0xe8);
  *(undefined8 *)(in_RDI + 0xa0) = uVar11;
  *(undefined8 *)(in_RDI + 0xa8) = uVar12;
  *(undefined8 *)(in_RDI + 0xb0) = uVar15;
  *(undefined8 *)(in_RDI + 0xb8) = uVar16;
  *(undefined8 *)(in_RDI + 0xc0) = uVar3;
  *(undefined8 *)(in_RDI + 200) = uVar4;
  *(undefined8 *)(in_RDI + 0xd0) = *(undefined8 *)(in_RDI + 0xc0);
  *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(in_RDI + 200);
  *(undefined8 *)(in_RDI + 0xe0) = uVar7;
  *(undefined8 *)(in_RDI + 0xe8) = uVar8;
  *(undefined8 *)(in_RDI + 0xf0) = uVar13;
  *(undefined8 *)(in_RDI + 0xf8) = uVar14;
  return;
}

Assistant:

void bitrv216neg(double *a) {
  double x1r, x1i, x2r, x2i, x3r, x3i, x4r, x4i,
    x5r, x5i, x6r, x6i, x7r, x7i, x8r, x8i,
    x9r, x9i, x10r, x10i, x11r, x11i, x12r, x12i,
    x13r, x13i, x14r, x14i, x15r, x15i;

  x1r = a[2];
  x1i = a[3];
  x2r = a[4];
  x2i = a[5];
  x3r = a[6];
  x3i = a[7];
  x4r = a[8];
  x4i = a[9];
  x5r = a[10];
  x5i = a[11];
  x6r = a[12];
  x6i = a[13];
  x7r = a[14];
  x7i = a[15];
  x8r = a[16];
  x8i = a[17];
  x9r = a[18];
  x9i = a[19];
  x10r = a[20];
  x10i = a[21];
  x11r = a[22];
  x11i = a[23];
  x12r = a[24];
  x12i = a[25];
  x13r = a[26];
  x13i = a[27];
  x14r = a[28];
  x14i = a[29];
  x15r = a[30];
  x15i = a[31];
  a[2] = x15r;
  a[3] = x15i;
  a[4] = x7r;
  a[5] = x7i;
  a[6] = x11r;
  a[7] = x11i;
  a[8] = x3r;
  a[9] = x3i;
  a[10] = x13r;
  a[11] = x13i;
  a[12] = x5r;
  a[13] = x5i;
  a[14] = x9r;
  a[15] = x9i;
  a[16] = x1r;
  a[17] = x1i;
  a[18] = x14r;
  a[19] = x14i;
  a[20] = x6r;
  a[21] = x6i;
  a[22] = x10r;
  a[23] = x10i;
  a[24] = x2r;
  a[25] = x2i;
  a[26] = x12r;
  a[27] = x12i;
  a[28] = x4r;
  a[29] = x4i;
  a[30] = x8r;
  a[31] = x8i;
}